

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::finish
          (Fasttrack<std::shared_mutex> *this,tls_t tls,tid_t thread_id)

{
  tid_t local_20;
  
  local_20 = thread_id;
  std::__shared_mutex_pthread::lock(&(this->g_lock)._M_impl);
  phmap::container_internal::
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  ::erase<unsigned_long>
            ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
              *)&this->threads,&local_20);
  cleanup(this,(EVP_PKEY_CTX *)(local_20 & 0xffffffff));
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->g_lock);
  return;
}

Assistant:

void finish(tls_t tls, tid_t thread_id) final {
    std::lock_guard<LockT> exLockT(g_lock);
    /// just delete thread from list, no backward sync needed
    threads.erase(thread_id);
    cleanup(thread_id);
  }